

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_header(BCWriteCtx *ctx)

{
  uint v;
  uint64_t uVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  char *local_60;
  char *p;
  MSize len;
  char *name;
  GCstr *chunkname;
  BCWriteCtx *ctx_local;
  char *local_28;
  
  uVar1 = (ctx->pt->chunkname).gcptr64;
  v = *(uint *)(uVar1 + 0x14);
  if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).b) < v + 10) {
    local_28 = lj_buf_need2(&ctx->sb,v + 10);
  }
  else {
    local_28 = (ctx->sb).b;
  }
  builtin_strncpy(local_28,"\x1bLJ\x02",4);
  cVar2 = '\0';
  if (ctx->strip != 0) {
    cVar2 = '\x02';
  }
  cVar4 = '\0';
  if ((ctx->pt->flags & 4) != 0) {
    cVar4 = '\x04';
  }
  local_60 = local_28 + 5;
  local_28[4] = cVar2 + cVar4 + '\b';
  if (ctx->strip == 0) {
    local_60 = lj_strfmt_wuleb128(local_60,v);
    memcpy(local_60,(void *)(uVar1 + 0x18),(ulong)v);
    local_60 = local_60 + v;
  }
  iVar3 = (*ctx->wfunc)((lua_State *)((ctx->sb).L.ptr64 & 0xfffffffffffffff8),(ctx->sb).b,
                        (size_t)(SUB88(local_60,0) + (long)SUB88((ctx->sb).b,0) * 0xffffffff),
                        ctx->wdata);
  ctx->status = iVar3;
  return;
}

Assistant:

static void bcwrite_header(BCWriteCtx *ctx)
{
  GCstr *chunkname = proto_chunkname(ctx->pt);
  const char *name = strdata(chunkname);
  MSize len = chunkname->len;
  char *p = lj_buf_need(&ctx->sb, 5+5+len);
  *p++ = BCDUMP_HEAD1;
  *p++ = BCDUMP_HEAD2;
  *p++ = BCDUMP_HEAD3;
  *p++ = BCDUMP_VERSION;
  *p++ = (ctx->strip ? BCDUMP_F_STRIP : 0) +
	 LJ_BE*BCDUMP_F_BE +
	 ((ctx->pt->flags & PROTO_FFI) ? BCDUMP_F_FFI : 0) +
	 LJ_FR2*BCDUMP_F_FR2;
  if (!ctx->strip) {
    p = lj_strfmt_wuleb128(p, len);
    p = lj_buf_wmem(p, name, len);
  }
  ctx->status = ctx->wfunc(sbufL(&ctx->sb), ctx->sb.b,
			   (MSize)(p - ctx->sb.b), ctx->wdata);
}